

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

Enum xatlas::AddUvMesh(Atlas *atlas,UvMeshDecl *decl)

{
  undefined *puVar1;
  undefined4 uVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  uint32_t uVar6;
  UvMeshInstance *this;
  Vector2 *pVVar7;
  UvMesh **ppUVar8;
  UvMesh *pUVar9;
  uint *puVar10;
  Array<xatlas::internal::Vector2> *pAVar11;
  UvMeshChart *this_00;
  bool bVar12;
  uint32_t local_194;
  uint32_t local_15c;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint32_t vertex;
  uint32_t j;
  uint32_t i_6;
  uint32_t face2;
  uint32_t mapIndex;
  Vector2 *texcoord_1;
  uint local_108;
  uint32_t i_5;
  uint32_t face;
  uint32_t f2;
  uint32_t faceCount2;
  bool newFaceAssigned;
  UvMeshChart *chart;
  undefined1 local_e8 [4];
  uint32_t f;
  BitArray faceAssigned;
  uint32_t local_b8;
  uint32_t i_4;
  uint32_t faceCount;
  HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
  vertexToFaceMap;
  uint32_t local_60;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t m;
  UvMesh *mesh;
  float fStack_48;
  Vector2 texcoord;
  uint32_t i_1;
  UvMeshInstance *meshInstance;
  uint32_t index;
  uint32_t i;
  uint32_t indexCount;
  bool decoded;
  Context *ctx;
  UvMeshDecl *decl_local;
  Atlas *atlas_local;
  
  puVar1 = internal::s_print;
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x22bb,"AddMeshError::Enum xatlas::AddUvMesh(Atlas *, const UvMeshDecl &)");
  }
  if (atlas == (Atlas *)0x0) {
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)("AddUvMesh: atlas is null.\n");
    }
    atlas_local._4_4_ = Error;
  }
  else if (atlas[1].width == 0) {
    bVar12 = decl->indexCount != 0;
    if (bVar12) {
      local_130 = decl->indexCount;
    }
    else {
      local_130 = decl->vertexCount;
    }
    if ((internal::s_print != (undefined *)0x0) && ((internal::s_printVerbose & 1) != 0)) {
      uVar4 = internal::Array<xatlas::internal::UvMesh_*>::size
                        ((Array<xatlas::internal::UvMesh_*> *)&atlas[4].atlasCount);
      (*(code *)puVar1)("Adding UV mesh %d: %u vertices, %u triangles\n",uVar4,decl->vertexCount,
                        (ulong)local_130 / 3);
    }
    if (local_130 % 3 == 0) {
      if (bVar12) {
        for (meshInstance._4_4_ = 0; meshInstance._4_4_ < local_130;
            meshInstance._4_4_ = meshInstance._4_4_ + 1) {
          uVar4 = DecodeIndex(decl->indexFormat,decl->indexData,decl->indexOffset,meshInstance._4_4_
                             );
          if (decl->vertexCount <= uVar4) {
            return IndexOutOfRange;
          }
        }
      }
      this = (UvMeshInstance *)
             internal::Realloc((void *)0x0,0x28,0,
                               "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                               ,0x22d3);
      memset(this,0,0x28);
      internal::UvMeshInstance::UvMeshInstance(this);
      unique0x10000a51 = this;
      internal::Array<xatlas::internal::Vector2>::resize(&this->texcoords,decl->vertexCount);
      for (texcoord.x = 0.0; (uint)texcoord.x < decl->vertexCount;
          texcoord.x = (float)((int)texcoord.x + 1)) {
        unique0x00012000 =
             *(Vector2 *)((long)decl->vertexUvData + (ulong)(decl->vertexStride * (int)texcoord.x));
        bVar3 = internal::isNan(mesh._4_4_);
        if (bVar3) {
LAB_00218be1:
          mesh._4_4_ = 0.0;
          fStack_48 = 0.0;
        }
        else {
          bVar3 = internal::isNan(fStack_48);
          if (bVar3) goto LAB_00218be1;
        }
        pVVar7 = internal::Array<xatlas::internal::Vector2>::operator[]
                           (&stack0xffffffffffffffc0->texcoords,(uint32_t)texcoord.x);
        *pVVar7 = stack0xffffffffffffffb4;
      }
      stack0xffffffffffffffc0->rotateCharts = (bool)(decl->rotateCharts & 1);
      _i_2 = (UvMesh *)0x0;
      for (i_3 = 0; uVar4 = internal::Array<xatlas::internal::UvMesh_*>::size
                                      ((Array<xatlas::internal::UvMesh_*> *)&atlas[4].atlasCount),
          i_3 < uVar4; i_3 = i_3 + 1) {
        ppUVar8 = internal::Array<xatlas::internal::UvMesh_*>::operator[]
                            ((Array<xatlas::internal::UvMesh_*> *)&atlas[4].atlasCount,i_3);
        iVar5 = memcmp(*ppUVar8,decl,0x38);
        if (iVar5 == 0) {
          ppUVar8 = internal::Array<xatlas::internal::UvMesh_*>::operator[]
                              ((Array<xatlas::internal::UvMesh_*> *)&atlas[4].atlasCount,i_3);
          _i_2 = *ppUVar8;
          stack0xffffffffffffffc0->mesh = _i_2;
          break;
        }
      }
      if (_i_2 == (UvMesh *)0x0) {
        pUVar9 = (UvMesh *)
                 internal::Realloc((void *)0x0,0x80,0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                                   ,0x22e7);
        memset(pUVar9,0,0x80);
        internal::UvMesh::UvMesh(pUVar9);
        stack0xffffffffffffffc0->mesh = pUVar9;
        _i_2 = pUVar9;
        memcpy(pUVar9,decl,0x31);
        internal::Array<unsigned_int>::resize(&_i_2->indices,decl->indexCount);
        for (local_60 = 0; local_60 < local_130; local_60 = local_60 + 1) {
          if (bVar12) {
            local_15c = DecodeIndex(decl->indexFormat,decl->indexData,decl->indexOffset,local_60);
          }
          else {
            local_15c = local_60;
          }
          puVar10 = internal::Array<unsigned_int>::operator[](&_i_2->indices,local_60);
          *puVar10 = local_15c;
        }
        internal::Array<unsigned_int>::resize(&_i_2->vertexToChartMap,decl->vertexCount);
        for (vertexToFaceMap.m_next.m_base._20_4_ = 0; uVar2 = vertexToFaceMap.m_next.m_base._20_4_,
            uVar4 = internal::Array<unsigned_int>::size(&_i_2->vertexToChartMap),
            (uint)uVar2 < uVar4;
            vertexToFaceMap.m_next.m_base._20_4_ = vertexToFaceMap.m_next.m_base._20_4_ + 1) {
          puVar10 = internal::Array<unsigned_int>::operator[]
                              (&_i_2->vertexToChartMap,vertexToFaceMap.m_next.m_base._20_4_);
          *puVar10 = 0xffffffff;
        }
        internal::
        HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
        ::HashMap((HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                   *)&i_4,0,local_130);
        for (local_b8 = 0; local_b8 < local_130; local_b8 = local_b8 + 1) {
          pAVar11 = &stack0xffffffffffffffc0->texcoords;
          puVar10 = internal::Array<unsigned_int>::operator[](&_i_2->indices,local_b8);
          pVVar7 = internal::Array<xatlas::internal::Vector2>::operator[](pAVar11,*puVar10);
          internal::
          HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
          ::add((HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                 *)&i_4,pVVar7);
        }
        internal::BitArray::BitArray((BitArray *)local_e8,local_130 / 3);
        internal::BitArray::zeroOutMemory((BitArray *)local_e8);
        for (chart._4_4_ = 0; chart._4_4_ < local_130 / 3; chart._4_4_ = chart._4_4_ + 1) {
          bVar12 = internal::BitArray::get((BitArray *)local_e8,chart._4_4_);
          if (!bVar12) {
            this_00 = (UvMeshChart *)
                      internal::Realloc((void *)0x0,0x38,0,
                                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                                        ,0x22fa);
            (this_00->indices).m_base.elementSize = 0;
            (this_00->indices).m_base.size = 0;
            *(undefined8 *)&(this_00->indices).m_base.capacity = 0;
            *(undefined8 *)&(this_00->faces).m_base.capacity = 0;
            (this_00->indices).m_base.buffer = (uint8_t *)0x0;
            (this_00->faces).m_base.buffer = (uint8_t *)0x0;
            (this_00->faces).m_base.elementSize = 0;
            (this_00->faces).m_base.size = 0;
            *(undefined8 *)&this_00->material = 0;
            internal::UvMeshChart::UvMeshChart(this_00);
            if (decl->faceMaterialData == (uint32_t *)0x0) {
              local_194 = 0;
            }
            else {
              local_194 = decl->faceMaterialData[chart._4_4_];
            }
            this_00->material = local_194;
            _faceCount2 = this_00;
            internal::BitArray::set((BitArray *)local_e8,chart._4_4_);
            internal::Array<unsigned_int>::push_back(&_faceCount2->faces,(uint *)((long)&chart + 4))
            ;
            do {
              f2._3_1_ = 0;
              face = internal::Array<unsigned_int>::size(&_faceCount2->faces);
              for (i_5 = 0; i_5 < face; i_5 = i_5 + 1) {
                puVar10 = internal::Array<unsigned_int>::operator[](&_faceCount2->faces,i_5);
                local_108 = *puVar10;
                for (texcoord_1._4_4_ = 0; texcoord_1._4_4_ < 3;
                    texcoord_1._4_4_ = texcoord_1._4_4_ + 1) {
                  pAVar11 = &stack0xffffffffffffffc0->texcoords;
                  puVar10 = internal::Array<unsigned_int>::operator[]
                                      (&stack0xffffffffffffffc0->mesh->indices,
                                       local_108 * 3 + texcoord_1._4_4_);
                  _face2 = internal::Array<xatlas::internal::Vector2>::operator[](pAVar11,*puVar10);
                  for (i_6 = internal::
                             HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                             ::get((HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                                    *)&i_4,_face2); i_6 != 0xffffffff;
                      i_6 = internal::
                            HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                            ::getNext((HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                                       *)&i_4,i_6)) {
                    j = i_6 / 3;
                    bVar12 = internal::BitArray::get((BitArray *)local_e8,j);
                    if ((!bVar12) &&
                       ((decl->faceMaterialData == (uint32_t *)0x0 ||
                        (decl->faceMaterialData[local_108] == decl->faceMaterialData[j])))) {
                      internal::BitArray::set((BitArray *)local_e8,j);
                      internal::Array<unsigned_int>::push_back(&_faceCount2->faces,&j);
                      f2._3_1_ = 1;
                    }
                  }
                }
              }
            } while ((f2._3_1_ & 1) != 0);
            for (vertex = 0; uVar4 = vertex,
                uVar6 = internal::Array<unsigned_int>::size(&_faceCount2->faces), uVar4 < uVar6;
                vertex = vertex + 1) {
              for (local_128 = 0; local_128 < 3; local_128 = local_128 + 1) {
                pUVar9 = stack0xffffffffffffffc0->mesh;
                puVar10 = internal::Array<unsigned_int>::operator[](&_faceCount2->faces,vertex);
                puVar10 = internal::Array<unsigned_int>::operator[]
                                    (&pUVar9->indices,*puVar10 * 3 + local_128);
                local_12c = *puVar10;
                internal::Array<unsigned_int>::push_back(&_faceCount2->indices,&local_12c);
                uVar4 = internal::Array<xatlas::internal::UvMeshChart_*>::size(&_i_2->charts);
                puVar10 = internal::Array<unsigned_int>::operator[]
                                    (&_i_2->vertexToChartMap,local_12c);
                *puVar10 = uVar4;
              }
            }
            internal::Array<xatlas::internal::UvMeshChart_*>::push_back
                      (&_i_2->charts,(UvMeshChart **)&faceCount2);
          }
        }
        internal::Array<xatlas::internal::UvMesh_*>::push_back
                  ((Array<xatlas::internal::UvMesh_*> *)&atlas[4].atlasCount,(UvMesh **)&i_2);
        internal::BitArray::~BitArray((BitArray *)local_e8);
        internal::
        HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
        ::~HashMap((HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                    *)&i_4);
      }
      else if ((internal::s_print != (undefined *)0x0) && ((internal::s_printVerbose & 1) != 0)) {
        (*(code *)internal::s_print)("   instance of a previous UV mesh\n");
      }
      puVar1 = internal::s_print;
      if ((internal::s_print != (undefined *)0x0) && ((internal::s_printVerbose & 1) != 0)) {
        uVar4 = internal::Array<xatlas::internal::UvMeshChart_*>::size
                          (&stack0xffffffffffffffc0->mesh->charts);
        (*(code *)puVar1)("   %u charts\n",uVar4);
      }
      internal::Array<xatlas::internal::UvMeshInstance_*>::push_back
                ((Array<xatlas::internal::UvMeshInstance_*> *)&atlas[4].utilization,
                 (UvMeshInstance **)&texcoord.y);
      atlas_local._4_4_ = Success;
    }
    else {
      atlas_local._4_4_ = InvalidIndexCount;
    }
  }
  else {
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
    atlas_local._4_4_ = Error;
  }
  return atlas_local._4_4_;
}

Assistant:

AddMeshError::Enum AddUvMesh(Atlas *atlas, const UvMeshDecl &decl)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddUvMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (ctx->meshCount > 0) {
		XA_PRINT_WARNING("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
	const bool decoded = (decl.indexCount <= 0);
	const uint32_t indexCount = decoded ? decl.vertexCount : decl.indexCount;
	XA_PRINT("Adding UV mesh %d: %u vertices, %u triangles\n", ctx->uvMeshes.size(), decl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (!decoded) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
			if (index >= decl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	internal::UvMeshInstance *meshInstance = XA_NEW(internal::MemTag::Default, internal::UvMeshInstance);
	meshInstance->texcoords.resize(decl.vertexCount);
	for (uint32_t i = 0; i < decl.vertexCount; i++) {
		internal::Vector2 texcoord = *((const internal::Vector2 *)&((const uint8_t *)decl.vertexUvData)[decl.vertexStride * i]);
		// Set nan values to 0.
		if (internal::isNan(texcoord.x) || internal::isNan(texcoord.y))
			texcoord.x = texcoord.y = 0.0f;
		meshInstance->texcoords[i] = texcoord;
	}
	meshInstance->rotateCharts = decl.rotateCharts;
	// See if this is an instance of an already existing mesh.
	internal::UvMesh *mesh = nullptr;
	for (uint32_t m = 0; m < ctx->uvMeshes.size(); m++) {
		if (memcmp(&ctx->uvMeshes[m]->decl, &decl, sizeof(UvMeshDecl)) == 0) {
			meshInstance->mesh = mesh = ctx->uvMeshes[m];
			break;
		}
	}
	if (!mesh) {
		// Copy geometry to mesh.
		meshInstance->mesh = mesh = XA_NEW(internal::MemTag::Default, internal::UvMesh);
		mesh->decl = decl;
		mesh->indices.resize(decl.indexCount);
		for (uint32_t i = 0; i < indexCount; i++)
			mesh->indices[i] = decoded ? i : DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
		mesh->vertexToChartMap.resize(decl.vertexCount);
		for (uint32_t i = 0; i < mesh->vertexToChartMap.size(); i++)
			mesh->vertexToChartMap[i] = UINT32_MAX;
		// Calculate charts (incident faces).
		internal::HashMap<internal::Vector2> vertexToFaceMap(internal::MemTag::Default, indexCount); // Face is index / 3
		const uint32_t faceCount = indexCount / 3;
		for (uint32_t i = 0; i < indexCount; i++)
			vertexToFaceMap.add(meshInstance->texcoords[mesh->indices[i]]);
		internal::BitArray faceAssigned(faceCount);
		faceAssigned.zeroOutMemory();
		for (uint32_t f = 0; f < faceCount; f++) {
			if (faceAssigned.get(f))
				continue;
			// Found an unassigned face, create a new chart.
			internal::UvMeshChart *chart = XA_NEW(internal::MemTag::Default, internal::UvMeshChart);
			chart->material = decl.faceMaterialData ? decl.faceMaterialData[f] : 0;
			// Walk incident faces and assign them to the chart.
			faceAssigned.set(f);
			chart->faces.push_back(f);
			for (;;) {
				bool newFaceAssigned = false;
				const uint32_t faceCount2 = chart->faces.size();
				for (uint32_t f2 = 0; f2 < faceCount2; f2++) {
					const uint32_t face = chart->faces[f2];
					for (uint32_t i = 0; i < 3; i++) {
						const internal::Vector2 &texcoord = meshInstance->texcoords[meshInstance->mesh->indices[face * 3 + i]];
						uint32_t mapIndex = vertexToFaceMap.get(texcoord);
						while (mapIndex != UINT32_MAX) {
							const uint32_t face2 = mapIndex / 3; // 3 vertices added per face.
							// Materials must match.
							if (!faceAssigned.get(face2) && (!decl.faceMaterialData || decl.faceMaterialData[face] == decl.faceMaterialData[face2])) {
								faceAssigned.set(face2);
								chart->faces.push_back(face2);
								newFaceAssigned = true;
							}
							mapIndex = vertexToFaceMap.getNext(mapIndex);
						}
					}
				}
				if (!newFaceAssigned)
					break;
			}
			for (uint32_t i = 0; i < chart->faces.size(); i++) {
				for (uint32_t j = 0; j < 3; j++) {
					const uint32_t vertex = meshInstance->mesh->indices[chart->faces[i] * 3 + j];
					chart->indices.push_back(vertex);
					mesh->vertexToChartMap[vertex] = mesh->charts.size();
				}
			}
			mesh->charts.push_back(chart);
		}
		ctx->uvMeshes.push_back(mesh);
	} else {
		XA_PRINT("   instance of a previous UV mesh\n");
	}
	XA_PRINT("   %u charts\n", meshInstance->mesh->charts.size());
	ctx->uvMeshInstances.push_back(meshInstance);
	return AddMeshError::Success;
}